

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZQuadraticPrism *in_RDI;
  string *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  TPZQuadraticPrism *in_stack_ffffffffffffff70;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  uVar1 = Hash(in_stack_ffffffffffffff40);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x177f416);
  pzgeom::TPZQuadraticPrism::TPZQuadraticPrism(in_RDI);
  iVar3 = pzgeom::TPZQuadraticPrism::ClassId(in_stack_ffffffffffffff70);
  pzgeom::TPZQuadraticPrism::~TPZQuadraticPrism((TPZQuadraticPrism *)0x177f463);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}